

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  int iVar1;
  secp256k1_fe *a;
  
  iVar1 = secp256k1_ge_is_infinity(r);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0x5a,"test condition failed: !secp256k1_ge_is_infinity(r)");
    abort();
  }
  a = &r->y;
  iVar1 = secp256k1_fe_is_odd(a);
  if (iVar1 != 0) {
    secp256k1_fe_negate_unchecked(a,a,1);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}